

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O0

void drop_callback(GLFWwindow *window,int count,char **paths)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  Slot *slot;
  int i;
  char **paths_local;
  int count_local;
  GLFWwindow *window_local;
  
  pvVar3 = glfwGetWindowUserPointer(window);
  uVar2 = counter;
  counter = counter + 1;
  uVar1 = *(uint *)((long)pvVar3 + 8);
  glfwGetTime();
  printf("%08x to %i at %0.3f: Drop input\n",(ulong)uVar2,(ulong)uVar1);
  for (slot._4_4_ = 0; (int)slot._4_4_ < count; slot._4_4_ = slot._4_4_ + 1) {
    printf("  %i: \"%s\"\n",(ulong)slot._4_4_,paths[(int)slot._4_4_]);
  }
  return;
}

Assistant:

static void drop_callback(GLFWwindow* window, int count, const char** paths)
{
    int i;
    Slot* slot = glfwGetWindowUserPointer(window);

    printf("%08x to %i at %0.3f: Drop input\n",
           counter++, slot->number, glfwGetTime());

    for (i = 0;  i < count;  i++)
        printf("  %i: \"%s\"\n", i, paths[i]);
}